

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

void Cnf_CutRef(Cnf_Man_t *p,Cnf_Cut_t *pCut)

{
  bool bVar1;
  int local_24;
  Aig_Obj_t *pAStack_20;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Cut_t *pCut_local;
  Cnf_Man_t *p_local;
  
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < pCut->nFanins) {
      pAStack_20 = Aig_ManObj(p->pManAig,*(int *)((long)pCut[1].vIsop + (long)local_24 * 4 + -8));
      bVar1 = pAStack_20 != (Aig_Obj_t *)0x0;
    }
    if (!bVar1) break;
    *(ulong *)&pAStack_20->field_0x18 =
         *(ulong *)&pAStack_20->field_0x18 & 0xffffffff0000003f |
         ((ulong)(((uint)(*(ulong *)&pAStack_20->field_0x18 >> 6) & 0x3ffffff) + 1) & 0x3ffffff) <<
         6;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Cnf_CutRef( Cnf_Man_t * p, Cnf_Cut_t * pCut )
{
    Aig_Obj_t * pObj;
    int i;
    Cnf_CutForEachLeaf( p->pManAig, pCut, pObj, i )
    {
        pObj->nRefs++;
    }
}